

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::V1LayerParameter::V1LayerParameter(V1LayerParameter *this)

{
  V1LayerParameter *pVVar1;
  V1LayerParameter *this_local;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__V1LayerParameter_00d506f0;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,8);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->bottom_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->top_);
  google::protobuf::RepeatedPtrField<caffe::BlobProto>::RepeatedPtrField(&this->blobs_);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->blobs_lr_);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->weight_decay_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::RepeatedPtrField(&this->include_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::RepeatedPtrField(&this->exclude_);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->loss_weight_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->param_);
  google::protobuf::RepeatedField<int>::RepeatedField(&this->blob_share_mode_);
  pVVar1 = internal_default_instance();
  if (this != pVVar1) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

V1LayerParameter::V1LayerParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.V1LayerParameter)
}